

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O0

void __thiscall OpenMD::StaticAnalyser::writeOutput(StaticAnalyser *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  string *psVar6;
  ulong uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  pointer pBVar9;
  undefined8 uVar10;
  StaticAnalyser *in_RDI;
  string message_1;
  OutputData *data_2;
  iterator __end3_1;
  iterator __begin3_1;
  vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
  *__range3_1;
  uint bin_1;
  string message;
  OutputData *data_1;
  iterator __end3;
  iterator __begin3;
  vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
  *__range3;
  uint bin;
  uint type;
  OutputData *data;
  iterator __end2;
  iterator __begin2;
  vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
  *__range2;
  Revision r;
  ofstream ofs;
  AtomType *in_stack_fffffffffffffb48;
  errorStruct *peVar11;
  ostream *in_stack_fffffffffffffb50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb58;
  vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
  *in_stack_fffffffffffffb60;
  Revision *in_stack_fffffffffffffb68;
  ostream *in_stack_fffffffffffffb78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb90;
  ostream *in_stack_fffffffffffffb98;
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  reference local_390;
  OutputData *local_388;
  __normal_iterator<OpenMD::StaticAnalyser::OutputData_*,_std::vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>_>
  local_380;
  vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
  *local_378;
  uint local_36c;
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  reference local_2e8;
  OutputData *local_2e0;
  __normal_iterator<OpenMD::StaticAnalyser::OutputData_*,_std::vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>_>
  local_2d8;
  vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
  *local_2d0;
  uint local_2c4;
  string local_2c0 [36];
  uint local_29c;
  type_index local_298;
  vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
  *local_290;
  type_index local_288;
  undefined8 local_280;
  reference local_278;
  OutputData *local_270;
  __normal_iterator<OpenMD::StaticAnalyser::OutputData_*,_std::vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>_>
  local_268;
  vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
  *local_260;
  string local_258 [32];
  string local_238 [48];
  long local_208 [65];
  
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar4,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    uVar10 = std::__cxx11::string::c_str();
    peVar11 = &painCave;
    snprintf(painCave.errMsg,2000,"StaticAnalyser: unable to open %s\n",uVar10);
    peVar11->isFatal = 1;
    simError();
  }
  else {
    poVar5 = std::operator<<((ostream *)local_208,"# ");
    psVar6 = getAnalysisType_abi_cxx11_(in_RDI);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<((ostream *)local_208,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_((Revision *)poVar5);
    poVar5 = std::operator<<(poVar5,local_238);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_238);
    poVar5 = std::operator<<((ostream *)local_208,"# ");
    Revision::getBuildDate_abi_cxx11_(in_stack_fffffffffffffb68);
    poVar5 = std::operator<<(poVar5,local_258);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_258);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      in_stack_fffffffffffffb98 = std::operator<<((ostream *)local_208,"# parameters: ");
      in_stack_fffffffffffffb90 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<(in_stack_fffffffffffffb98,(string *)&in_RDI->paramString_);
      std::operator<<((ostream *)in_stack_fffffffffffffb90,"\n");
    }
    std::operator<<((ostream *)local_208,"#");
    local_260 = &in_RDI->data_;
    local_268._M_current =
         (OutputData *)
         std::
         vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
         ::begin((vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
                  *)in_stack_fffffffffffffb48);
    local_270 = (OutputData *)
                std::
                vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
                ::end((vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
                       *)in_stack_fffffffffffffb48);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<OpenMD::StaticAnalyser::OutputData_*,_std::vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>_>
                               *)in_stack_fffffffffffffb50,
                              (__normal_iterator<OpenMD::StaticAnalyser::OutputData_*,_std::vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>_>
                               *)in_stack_fffffffffffffb48), bVar2) {
      local_278 = __gnu_cxx::
                  __normal_iterator<OpenMD::StaticAnalyser::OutputData_*,_std::vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>_>
                  ::operator*(&local_268);
      bVar2 = std::
              vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
              ::empty(in_stack_fffffffffffffb60);
      if (!bVar2) {
        in_stack_fffffffffffffb88 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<((ostream *)local_208,"\t");
        in_stack_fffffffffffffb80 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<((ostream *)in_stack_fffffffffffffb88,(string *)local_278);
        in_stack_fffffffffffffb78 = std::operator<<((ostream *)in_stack_fffffffffffffb80,"(");
        poVar5 = std::operator<<(in_stack_fffffffffffffb78,(string *)&local_278->units);
        std::operator<<(poVar5,")");
        std::
        vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
        ::operator[](&local_278->accumulator,0);
        pBVar9 = std::
                 unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                 ::operator->((unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                               *)0x1bac8b);
        iVar3 = (*pBVar9->_vptr_BaseAccumulator[7])();
        local_280 = CONCAT44(extraout_var,iVar3);
        std::type_index::type_index(&local_288,(type_info *)&Vector3<double>::typeinfo);
        bVar2 = std::type_index::operator==
                          ((type_index *)in_stack_fffffffffffffb50,
                           (type_index *)in_stack_fffffffffffffb48);
        if (bVar2) {
          std::operator<<((ostream *)local_208,"\t\t");
        }
        std::
        vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
        ::operator[](&local_278->accumulator,0);
        pBVar9 = std::
                 unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                 ::operator->((unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                               *)0x1bad0f);
        iVar3 = (*pBVar9->_vptr_BaseAccumulator[7])();
        in_stack_fffffffffffffb60 =
             (vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
              *)CONCAT44(extraout_var_00,iVar3);
        local_290 = in_stack_fffffffffffffb60;
        std::type_index::type_index
                  (&local_298,(type_info *)&std::vector<double,std::allocator<double>>::typeinfo);
        bVar2 = std::type_index::operator==
                          ((type_index *)in_stack_fffffffffffffb50,
                           (type_index *)in_stack_fffffffffffffb48);
        if (bVar2) {
          std::operator<<((ostream *)local_208,"(");
          local_29c = 0;
          while( true ) {
            in_stack_fffffffffffffb58 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ulong)local_29c;
            pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::size
                               (&in_RDI->outputTypes_);
            if (pbVar8 <= in_stack_fffffffffffffb58) break;
            std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::operator[]
                      (&in_RDI->outputTypes_,(ulong)local_29c);
            AtomType::getName_abi_cxx11_(in_stack_fffffffffffffb48);
            in_stack_fffffffffffffb50 = std::operator<<((ostream *)local_208,local_2c0);
            std::operator<<(in_stack_fffffffffffffb50,"\t");
            std::__cxx11::string::~string(local_2c0);
            local_29c = local_29c + 1;
          }
          std::operator<<((ostream *)local_208,")\t");
        }
      }
      __gnu_cxx::
      __normal_iterator<OpenMD::StaticAnalyser::OutputData_*,_std::vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>_>
      ::operator++(&local_268);
    }
    std::ostream::operator<<(local_208,std::endl<char,std::char_traits<char>>);
    std::ios_base::precision((ios_base *)((long)local_208 + *(long *)(local_208[0] + -0x18)),8);
    for (local_2c4 = 0; local_2c4 < in_RDI->nBins_; local_2c4 = local_2c4 + 1) {
      local_2d0 = &in_RDI->data_;
      local_2d8._M_current =
           (OutputData *)
           std::
           vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
           ::begin((vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
                    *)in_stack_fffffffffffffb48);
      local_2e0 = (OutputData *)
                  std::
                  vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
                  ::end((vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
                         *)in_stack_fffffffffffffb48);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<OpenMD::StaticAnalyser::OutputData_*,_std::vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>_>
                                 *)in_stack_fffffffffffffb50,
                                (__normal_iterator<OpenMD::StaticAnalyser::OutputData_*,_std::vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>_>
                                 *)in_stack_fffffffffffffb48), bVar2) {
        local_2e8 = __gnu_cxx::
                    __normal_iterator<OpenMD::StaticAnalyser::OutputData_*,_std::vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>_>
                    ::operator*(&local_2d8);
        bVar2 = std::
                vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                ::empty(in_stack_fffffffffffffb60);
        if (!bVar2) {
          std::operator+((char *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
          std::operator+(in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50);
          std::__cxx11::to_string((uint)((ulong)in_stack_fffffffffffffb78 >> 0x20));
          std::operator+(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
          std::__cxx11::string::~string(local_368);
          std::__cxx11::string::~string(local_328);
          std::__cxx11::string::~string(local_348);
          std::
          vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
          ::operator[](&local_2e8->accumulator,(ulong)local_2c4);
          pBVar9 = std::
                   unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                   ::operator->((unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                 *)0x1bb027);
          (*pBVar9->_vptr_BaseAccumulator[9])
                    (pBVar9,local_208,local_308,(ulong)local_2e8->dataHandling);
          std::__cxx11::string::~string(local_308);
        }
        __gnu_cxx::
        __normal_iterator<OpenMD::StaticAnalyser::OutputData_*,_std::vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>_>
        ::operator++(&local_2d8);
      }
      std::ostream::operator<<(local_208,std::endl<char,std::char_traits<char>>);
    }
    std::operator<<((ostream *)local_208,"#######################################################\n"
                   );
    std::operator<<((ostream *)local_208,"# 95% confidence intervals in those quantities follow:\n")
    ;
    std::operator<<((ostream *)local_208,"#######################################################\n"
                   );
    for (local_36c = 0; local_36c < in_RDI->nBins_; local_36c = local_36c + 1) {
      std::operator<<((ostream *)local_208,"#");
      local_378 = &in_RDI->data_;
      local_380._M_current =
           (OutputData *)
           std::
           vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
           ::begin((vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
                    *)in_stack_fffffffffffffb48);
      local_388 = (OutputData *)
                  std::
                  vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
                  ::end((vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>
                         *)in_stack_fffffffffffffb48);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<OpenMD::StaticAnalyser::OutputData_*,_std::vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>_>
                                 *)in_stack_fffffffffffffb50,
                                (__normal_iterator<OpenMD::StaticAnalyser::OutputData_*,_std::vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>_>
                                 *)in_stack_fffffffffffffb48), bVar2) {
        local_390 = __gnu_cxx::
                    __normal_iterator<OpenMD::StaticAnalyser::OutputData_*,_std::vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>_>
                    ::operator*(&local_380);
        bVar2 = std::
                vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                ::empty(in_stack_fffffffffffffb60);
        if (!bVar2) {
          std::operator+((char *)in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
          std::operator+(in_stack_fffffffffffffb58,(char *)in_stack_fffffffffffffb50);
          std::__cxx11::to_string((uint)((ulong)in_stack_fffffffffffffb78 >> 0x20));
          std::operator+(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
          std::__cxx11::string::~string(local_410);
          std::__cxx11::string::~string(local_3d0);
          std::__cxx11::string::~string(local_3f0);
          std::
          vector<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
          ::operator[](&local_390->accumulator,(ulong)local_36c);
          pBVar9 = std::
                   unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                   ::operator->((unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>
                                 *)0x1bb2f7);
          (*pBVar9->_vptr_BaseAccumulator[10])(pBVar9,local_208,local_3b0,0);
          std::__cxx11::string::~string(local_3b0);
        }
        __gnu_cxx::
        __normal_iterator<OpenMD::StaticAnalyser::OutputData_*,_std::vector<OpenMD::StaticAnalyser::OutputData,_std::allocator<OpenMD::StaticAnalyser::OutputData>_>_>
        ::operator++(&local_380);
      }
      std::ostream::operator<<(local_208,std::endl<char,std::char_traits<char>>);
    }
    std::ostream::flush();
    std::ofstream::close();
  }
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void StaticAnalyser::writeOutput() {
    std::ofstream ofs(outputFilename_.c_str());

    if (ofs.is_open()) {
      Revision r;
      ofs << "# " << getAnalysisType() << "\n";
      ofs << "# OpenMD " << r.getFullRevision() << "\n";
      ofs << "# " << r.getBuildDate() << "\n";
      // ofs << "# selection script1: \"" << selectionScript1_ ;
      // ofs << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      // write title
      ofs << "#";
      for (const auto& data : data_) {
        if (!data.accumulator.empty()) {
          ofs << "\t" << data.title << "(" << data.units << ")";

          // add some extra tabs for column alignment
          if (data.accumulator[0]->getType() ==
              std::type_index(typeid(Vector3d))) {
            ofs << "\t\t";
          }

          if (data.accumulator[0]->getType() ==
              std::type_index(typeid(std::vector<RealType>))) {
            ofs << "(";
            for (unsigned int type = 0; type < outputTypes_.size(); type++) {
              ofs << outputTypes_[type]->getName() << "\t";
            }
            ofs << ")\t";
          }
        }
      }

      ofs << std::endl;

      ofs.precision(8);

      for (unsigned int bin = 0; bin < nBins_; bin++) {
        for (const auto& data : data_) {
          if (!data.accumulator.empty()) {
            std::string message =
                "StaticAnalyser detected a numerical error writing: " +
                data.title + " for bin " + std::to_string(bin);

            data.accumulator[bin]->writeData(ofs, message, data.dataHandling);
          }
        }
        ofs << std::endl;
      }

      ofs << "#######################################################\n";
      ofs << "# 95% confidence intervals in those quantities follow:\n";
      ofs << "#######################################################\n";

      for (unsigned int bin = 0; bin < nBins_; bin++) {
        ofs << "#";

        for (const auto& data : data_) {
          if (!data.accumulator.empty()) {
            std::string message =
                "StaticAnalyser detected a numerical error writing: " +
                data.title + " std. dev. for bin " + std::to_string(bin);

            data.accumulator[bin]->writeErrorBars(ofs, message);
          }
        }
        ofs << std::endl;
      }

      ofs.flush();
      ofs.close();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StaticAnalyser: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
  }